

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocations.h
# Opt level: O0

bool __thiscall Allocations::Key::operator<(Key *this,Key *other)

{
  bool bVar1;
  tuple<const_long_&,_const_long_&> local_38;
  tuple<const_long_&,_const_long_&> local_28;
  Key *local_18;
  Key *other_local;
  Key *this_local;
  
  local_18 = other;
  other_local = this;
  std::tie<long_const,long_const>((long *)&local_28,&this->fileID);
  std::tie<long_const,long_const>((long *)&local_38,&local_18->fileID);
  bVar1 = std::operator<(&local_28,&local_38);
  return bVar1;
}

Assistant:

inline bool operator <(const Allocations::Key &other) const
		{
			return std::tie(fileID, position) < std::tie(other.fileID, other.position);
		}